

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

void __thiscall smf::MidiFile::clearSequence(MidiFile *this,int track)

{
  pointer ppMVar1;
  ostream *poVar2;
  
  if ((-1 < track) &&
     (ppMVar1 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     track < (int)((ulong)((long)(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3)))
  {
    MidiEventList::clearSequence(ppMVar1[(uint)track]);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: track ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,track);
  poVar2 = std::operator<<(poVar2," does not exist.");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void MidiFile::clearSequence(int track) {
	if ((track >= 0) && (track < getTrackCount())) {
		operator[](track).clearSequence();
	} else {
		std::cerr << "Warning: track " << track << " does not exist." << std::endl;
	}
}